

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O3

void xmlRegisterDefaultInputCallbacks(void)

{
  long lVar1;
  long lVar2;
  int iVar3;
  
  if (xmlInputCallbackInitialized == '\0') {
    lVar2 = (long)xmlInputCallbackNr;
    iVar3 = xmlInputCallbackNr;
    if (lVar2 < 0xf) {
      xmlInputCallbackTable[lVar2].matchcallback = xmlFileMatch;
      xmlInputCallbackTable[lVar2].opencallback = xmlFileOpen;
      xmlInputCallbackTable[lVar2].readcallback = xmlFileRead;
      xmlInputCallbackTable[lVar2].closecallback = xmlFileClose;
      lVar1 = lVar2 + 1;
      iVar3 = (int)lVar1;
      if (xmlInputCallbackNr != 0xe) {
        xmlInputCallbackTable[lVar1].matchcallback = xmlGzfileMatch;
        xmlInputCallbackTable[lVar1].opencallback = xmlGzfileOpen;
        xmlInputCallbackTable[lVar1].readcallback = xmlGzfileRead;
        xmlInputCallbackTable[lVar1].closecallback = xmlGzfileClose;
        lVar2 = lVar2 + 2;
        iVar3 = (int)lVar2;
        if (xmlInputCallbackNr < 0xd) {
          xmlInputCallbackTable[lVar2].matchcallback = xmlXzfileMatch;
          xmlInputCallbackTable[lVar2].opencallback = xmlXzfileOpen;
          xmlInputCallbackTable[lVar2].readcallback = xmlXzfileRead;
          xmlInputCallbackTable[lVar2].closecallback = xmlXzfileClose;
          iVar3 = xmlInputCallbackNr + 3;
          if (xmlInputCallbackNr != 0xc) {
            xmlInputCallbackTable[iVar3].matchcallback = xmlIOHTTPMatch;
            xmlInputCallbackTable[iVar3].opencallback = xmlIOHTTPOpen;
            xmlInputCallbackTable[iVar3].readcallback = xmlIOHTTPRead;
            xmlInputCallbackTable[iVar3].closecallback = xmlIOHTTPClose;
            iVar3 = xmlInputCallbackNr + 4;
          }
        }
      }
    }
    xmlInputCallbackNr = iVar3;
    xmlInputCallbackInitialized = '\x01';
  }
  return;
}

Assistant:

void
xmlRegisterDefaultInputCallbacks(void) {
    if (xmlInputCallbackInitialized)
	return;

    xmlRegisterInputCallbacks(xmlFileMatch, xmlFileOpen,
	                      xmlFileRead, xmlFileClose);
#ifdef LIBXML_ZLIB_ENABLED
    xmlRegisterInputCallbacks(xmlGzfileMatch, xmlGzfileOpen,
	                      xmlGzfileRead, xmlGzfileClose);
#endif /* LIBXML_ZLIB_ENABLED */
#ifdef LIBXML_LZMA_ENABLED
    xmlRegisterInputCallbacks(xmlXzfileMatch, xmlXzfileOpen,
	                      xmlXzfileRead, xmlXzfileClose);
#endif /* LIBXML_LZMA_ENABLED */

#ifdef LIBXML_HTTP_ENABLED
    xmlRegisterInputCallbacks(xmlIOHTTPMatch, xmlIOHTTPOpen,
	                      xmlIOHTTPRead, xmlIOHTTPClose);
#endif /* LIBXML_HTTP_ENABLED */

#ifdef LIBXML_FTP_ENABLED
    xmlRegisterInputCallbacks(xmlIOFTPMatch, xmlIOFTPOpen,
	                      xmlIOFTPRead, xmlIOFTPClose);
#endif /* LIBXML_FTP_ENABLED */
    xmlInputCallbackInitialized = 1;
}